

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void Assimp::ExportSceneCollada
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *pDVar4;
  pointer pIVar5;
  undefined8 uVar6;
  streamoff sVar7;
  fpos local_420 [16];
  string local_410 [38];
  undefined1 local_3ea;
  allocator<char> local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_3a8;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [8];
  ColladaExporter iDoTheExportThing;
  string local_c0;
  undefined1 local_a0 [8];
  string file;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string path;
  ExportProperties *param_3_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  path.field_2._8_8_ = param_4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pFile,&local_69);
  DefaultIOSystem::absolutePath((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pFile,
             (allocator<char> *)
             ((long)&iDoTheExportThing.textures._M_t._M_impl.super__Rb_tree_header._M_node_count + 7
             ));
  DefaultIOSystem::completeBaseName((string *)local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&iDoTheExportThing.textures._M_t._M_impl.super__Rb_tree_header._M_node_count + 7
             ));
  ColladaExporter::ColladaExporter
            ((ColladaExporter *)local_358,pScene,pIOSystem,(string *)local_48,(string *)local_a0);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
    _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,pFile,
               (allocator<char> *)
               ((long)&outfile._M_t.
                       super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                       .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 7));
    std::operator+(&local_378,"output data creation failed. Most likely the file became too large: "
                   ,&local_398);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_378);
    outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
    _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
    super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar3 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_3a8,
             (pointer)CONCAT44(extraout_var,iVar3));
  bVar2 = std::operator==(&local_3a8,(nullptr_t)0x0);
  if (!bVar2) {
    pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_3a8);
    std::__cxx11::stringstream::str();
    uVar6 = std::__cxx11::string::c_str();
    local_420 = (fpos  [16])std::ostream::tellp();
    sVar7 = std::fpos::operator_cast_to_long(local_420);
    (*pIVar5->_vptr_IOStream[3])(pIVar5,uVar6,sVar7,1);
    std::__cxx11::string::~string(local_410);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_3a8);
    ColladaExporter::~ColladaExporter((ColladaExporter *)local_358);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  local_3ea = 1;
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,pFile,&local_3e9);
  std::operator+(&local_3c8,"could not open output .dae file: ",&local_3e8);
  DeadlyImportError::DeadlyImportError(pDVar4,&local_3c8);
  local_3ea = 0;
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ExportSceneCollada(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/) {
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // invoke the exporter
    ColladaExporter iDoTheExportThing( pScene, pIOSystem, path, file);
    
    if (iDoTheExportThing.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .dae file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}